

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O1

void ReplayingHammerer::find_direct_effective_aggs
               (HammeringPattern *pattern,PatternAddressMapper *mapper,
               unordered_set<AggressorAccessPattern,_std::hash<AggressorAccessPattern>,_std::equal_to<AggressorAccessPattern>,_std::allocator<AggressorAccessPattern>_>
               *direct_effective_aggs)

{
  _Base_ptr __k;
  pointer pvVar1;
  pointer pBVar2;
  pointer pAVar3;
  key_type *pkVar4;
  long lVar5;
  size_t args_1;
  int iVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  int iVar10;
  int iVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Aggressor *agg;
  pointer __k_00;
  key_type *__k_01;
  BitFlip *bf;
  pointer pBVar13;
  pointer pAVar14;
  long *plVar15;
  undefined1 local_2d0 [8];
  pair<int,_AggressorAccessPattern> data;
  ios_base local_250 [264];
  undefined1 local_148 [8];
  unordered_map<int,_std::pair<int,_AggressorAccessPattern>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>_>
  matches;
  set<int,_std::less<int>,_std::allocator<int>_> flipped_rows;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  long *local_c0;
  long local_b0 [2];
  pointer local_a0;
  pointer local_98;
  HammeringPattern *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  __hashtable *__h;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  PatternAddressMapper *local_60;
  _Base_ptr local_58;
  string local_50;
  
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&flipped_rows;
  flipped_rows._M_t._M_impl._0_4_ = 0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pvVar1 = (mapper->bit_flips).
           super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_90 = pattern;
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)direct_effective_aggs;
  local_60 = mapper;
  if ((mapper->bit_flips).
      super__Vector_base<std::vector<BitFlip,_std::allocator<BitFlip>_>,_std::allocator<std::vector<BitFlip,_std::allocator<BitFlip>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar1) {
    pBVar13 = (pvVar1->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pBVar2 = (pvVar1->super__Vector_base<BitFlip,_std::allocator<BitFlip>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pBVar13 != pBVar2) {
      do {
        local_2d0._0_4_ = (undefined4)(pBVar13->address).row;
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &matches._M_h._M_single_bucket,(int *)local_2d0);
        pBVar13 = pBVar13 + 1;
      } while (pBVar13 != pBVar2);
    }
    local_148 = (undefined1  [8])&matches._M_h._M_rehash_policy._M_next_resize;
    matches._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
    matches._M_h._M_bucket_count = 0;
    matches._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    matches._M_h._M_element_count._0_4_ = 0x3f800000;
    matches._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    matches._M_h._M_rehash_policy._4_4_ = 0;
    matches._M_h._M_rehash_policy._M_next_resize = 0;
    local_60 = (PatternAddressMapper *)&local_60->aggressor_to_addr;
    for (local_58 = flipped_rows._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_58 != (_Base_ptr)&flipped_rows;
        local_58 = (_Base_ptr)std::_Rb_tree_increment(local_58)) {
      pAVar14 = (local_90->agg_access_patterns).
                super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_98 = (local_90->agg_access_patterns).
                 super__Vector_base<AggressorAccessPattern,_std::allocator<AggressorAccessPattern>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pAVar14 != local_98) {
        __k = local_58 + 1;
        do {
          __k_00 = (pAVar14->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pAVar3 = (pAVar14->aggressors).super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          local_a0 = pAVar14;
          if (__k_00 == pAVar3) {
            iVar11 = 0x7fffffff;
          }
          else {
            iVar11 = 0x7fffffff;
            do {
              pmVar7 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)local_60,&__k_00->id);
              iVar6 = (int)pmVar7->row - __k->_M_color;
              iVar10 = -iVar6;
              if (0 < iVar6) {
                iVar10 = iVar6;
              }
              if (iVar11 <= iVar10) {
                iVar10 = iVar11;
              }
              iVar11 = iVar10;
              __k_00 = __k_00 + 1;
            } while (__k_00 != pAVar3);
          }
          sVar8 = std::
                  _Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::count((_Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)local_148,(key_type_conflict *)__k);
          pAVar14 = local_a0;
          if ((sVar8 == 0) ||
             ((sVar8 = std::
                       _Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::count((_Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                *)local_148,(key_type_conflict *)__k), sVar8 != 0 &&
              (pmVar9 = std::__detail::
                        _Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::at((_Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_148,(key_type *)__k), iVar11 < pmVar9->first)))) {
            data.second._8_8_ = pAVar14->start_offset;
            data._0_8_ = pAVar14->frequency;
            data.second.frequency = *(size_t *)&pAVar14->amplitude;
            local_2d0._0_4_ = iVar11;
            std::vector<Aggressor,_std::allocator<Aggressor>_>::vector
                      ((vector<Aggressor,_std::allocator<Aggressor>_> *)&data.second.start_offset,
                       &pAVar14->aggressors);
            pmVar9 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)local_148,(key_type *)__k);
            pmVar9->first = local_2d0._0_4_;
            AggressorAccessPattern::operator=(&pmVar9->second,(AggressorAccessPattern *)&data);
            if (data.second.start_offset != 0) {
              operator_delete((void *)data.second.start_offset,
                              (long)data.second.aggressors.
                                    super__Vector_base<Aggressor,_std::allocator<Aggressor>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              data.second.start_offset);
            }
          }
          pAVar14 = pAVar14 + 1;
        } while (pAVar14 != local_98);
      }
    }
    if (matches._M_h._M_bucket_count != 0) {
      plVar15 = (long *)matches._M_h._M_bucket_count;
      do {
        paVar12 = &local_50.field_2;
        if ((int)plVar15[2] < 6) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_2d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&data.second,"[",1);
          pkVar4 = (key_type *)plVar15[7];
          for (__k_01 = (key_type *)plVar15[6]; __k_01 != pkVar4; __k_01 = __k_01 + 1) {
            pmVar7 = std::__detail::
                     _Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<int,_std::pair<const_int,_DRAMAddr>,_std::allocator<std::pair<const_int,_DRAMAddr>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_60,__k_01);
            DRAMAddr::to_string_compact_abi_cxx11_(&local_50,pmVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&data.second,local_50._M_dataplus._M_p,local_50._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != paVar12) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
            if (*__k_01 != *(int *)(plVar15[7] + -4)) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&data.second,",",1);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&data.second,"]",1);
          __h = (__hashtable *)&local_70;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&__h,
                     "Flip in row %d, probably caused by [%s] -> %s due to minimum distance %d.","")
          ;
          lVar5 = plVar15[1];
          AggressorAccessPattern::to_string_abi_cxx11_
                    ((string *)&flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (AggressorAccessPattern *)(plVar15 + 3));
          args_1 = flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::__cxx11::stringbuf::str();
          format_string<int,char_const*,char_const*,int>
                    (&local_50,(string *)&__h,(int)lVar5,(char *)args_1,(char *)local_c0,
                     (int)plVar15[2]);
          Logger::log_data(&local_50,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if (local_c0 != local_b0) {
            operator_delete(local_c0,local_b0[0] + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count != &local_d0) {
            operator_delete((void *)flipped_rows._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            local_d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__h != &local_70) {
            operator_delete(__h,local_70._M_allocated_capacity + 1);
          }
          local_50._M_dataplus._M_p = (pointer)local_88;
          std::
          _Hashtable<AggressorAccessPattern,AggressorAccessPattern,std::allocator<AggressorAccessPattern>,std::__detail::_Identity,std::equal_to<AggressorAccessPattern>,std::hash<AggressorAccessPattern>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<AggressorAccessPattern_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<AggressorAccessPattern,false>>>>
                    ((_Hashtable<AggressorAccessPattern,AggressorAccessPattern,std::allocator<AggressorAccessPattern>,std::__detail::_Identity,std::equal_to<AggressorAccessPattern>,std::hash<AggressorAccessPattern>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_88,(AggressorAccessPattern *)(plVar15 + 3),&local_50);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_2d0);
          std::ios_base::~ios_base(local_250);
        }
        else {
          local_50._M_dataplus._M_p = (pointer)paVar12;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,
                     "Aggressor %d with distance %d from flipped row is too far away for being considered as effective. Skipping it."
                     ,"");
          format_string<int,int>((string *)local_2d0,&local_50,(int)plVar15[1],(int)plVar15[2]);
          Logger::log_info((string *)local_2d0,true);
          if ((AggressorAccessPattern *)CONCAT44(local_2d0._4_4_,local_2d0._0_4_) != &data.second) {
            operator_delete((undefined1 *)CONCAT44(local_2d0._4_4_,local_2d0._0_4_),
                            data.second.frequency + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar12) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        plVar15 = (long *)*plVar15;
      } while (plVar15 != (long *)0x0);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>,_std::allocator<std::pair<const_int,_std::pair<int,_AggressorAccessPattern>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_148);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &matches._M_h._M_single_bucket);
  return;
}

Assistant:

void ReplayingHammerer::find_direct_effective_aggs(HammeringPattern &pattern,
                                                   PatternAddressMapper &mapper,
                                                   std::unordered_set<AggressorAccessPattern> &direct_effective_aggs) {
  // we consider an aggressor as being responsible for a bit flip if it is at maximum DIST_THRESHOLD rows away from
  // the flipped row
  const int DIST_THRESHOLD = 5;

  // prerequisite: know which aggressor pair triggered a bit flip
  // get all flipped rows
  std::set<int> flipped_rows;
  if (mapper.bit_flips.size() == 0) return;
  for (const auto &bf : mapper.bit_flips.at(0)) flipped_rows.insert(static_cast<int>(bf.address.row));

  // map to keep track of best guess which AggressorAccessPattern caused a bit flip.
  // maps (aggressor ID) to (distance, AggressorAccessPattern)
  std::unordered_map<int, std::pair<int, AggressorAccessPattern>> matches;

  // iterate over all (unique) bit flips and compute the distance to all AggressorAccessPatterns, remember the
  // AggressorAccessPattern with the lowest distance - this is probably the one that triggered the bit flip
  // TODO: handle the case where multiple aggressors have the same distance to the flipped row
  // TODO: add threshold, e.g., if smallest distance of AggressorAccessPatterns and flipped row is larger than
  //  X rows, there's probably remapping going on and we cannot tell which AggressorAccessPattern caused the flip
  auto &cur_mapping = mapper.aggressor_to_addr;
  for (const auto &flipped_row : flipped_rows) {
    for (auto &agg_pair : pattern.agg_access_patterns) {
      // take the smaller distance of the aggressors as the distance of the aggressor pair
      int min_distance = std::numeric_limits<int>::max();
      for (const auto &agg : agg_pair.aggressors) {
        // measure distance between aggs in agg pairs and flipped bit
        auto cur_distance = std::abs((int) cur_mapping.at(agg.id).row - flipped_row);
        min_distance = std::min(min_distance, cur_distance);
      }
      // check if we don't have any 'best' candidate for this bit flip yet (a) or whether this distance is lower
      // than the distance of the best candidate found so far (b)
      if (matches.count(flipped_row)==0  // (a)
          || (matches.count(flipped_row) > 0 && matches.at(flipped_row).first > min_distance)) { // (b)
        auto data = std::make_pair(min_distance, agg_pair);
        matches[flipped_row] = data;
      }
    }
  }

  // direct_effective_aggs contains an AggressorAccessPattern for each flipped row, that's the pattern with the
  // lowest distance to the flipped row
  for (const auto &fr : matches) {
    // if the distance to the flipped row is larger than the defined threshold, we don't consider the aggressor as being
    // the one who triggered the bit flip as probably remapping is going on
    if (fr.second.first > DIST_THRESHOLD) {
      Logger::log_info(
          format_string("Aggressor %d with distance %d from flipped row is too far away for being considered as effective. Skipping it.",
          fr.first, fr.second.first));
      continue;
    }

    std::stringstream sstream;
    sstream << "[";
    for (auto &agg : fr.second.second.aggressors) {
      sstream << mapper.aggressor_to_addr.at(agg.id).to_string_compact();
      if (agg.id!=fr.second.second.aggressors.rbegin()->id) sstream << ",";
    }
    sstream << "]";
    Logger::log_data(format_string("Flip in row %d, probably caused by [%s] -> %s due to minimum distance %d.",
        fr.first, fr.second.second.to_string().c_str(), sstream.str().c_str(), fr.second.first));
    direct_effective_aggs.insert(fr.second.second);
  }
}